

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O2

Boolean llvm::isLegalUTF8String(UTF8 **source,UTF8 *sourceEnd)

{
  Boolean BVar1;
  long lVar2;
  byte *source_00;
  
  source_00 = *source;
  while( true ) {
    if (source_00 == sourceEnd) {
      return '\x01';
    }
    lVar2 = (long)(char)trailingBytesForUTF8[*source_00] + 1;
    if (((long)sourceEnd - (long)source_00 < lVar2) ||
       (BVar1 = isLegalUTF8(source_00,(int)lVar2), BVar1 == '\0')) break;
    source_00 = source_00 + lVar2;
    *source = source_00;
  }
  return '\0';
}

Assistant:

Boolean isLegalUTF8String(const UTF8 **source, const UTF8 *sourceEnd) {
    while (*source != sourceEnd) {
        int length = trailingBytesForUTF8[**source] + 1;
        if (length > sourceEnd - *source || !isLegalUTF8(*source, length))
            return false;
        *source += length;
    }
    return true;
}